

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

GPU_Target * GPU_LoadTarget(GPU_Image *image)

{
  GPU_Target *pGVar1;
  
  if ((_gpu_current_renderer == (GPU_Renderer *)0x0) ||
     (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0)) {
    pGVar1 = (GPU_Target *)0x0;
  }
  else {
    pGVar1 = (*_gpu_current_renderer->impl->GetTarget)(_gpu_current_renderer,image);
  }
  if (pGVar1 != (GPU_Target *)0x0) {
    pGVar1->refcount = pGVar1->refcount + 1;
  }
  return pGVar1;
}

Assistant:

GPU_Target* GPU_LoadTarget(GPU_Image* image)
{
	GPU_Target* result = GPU_GetTarget(image);
	
	if(result != NULL)
        result->refcount++;
    
    return result;
}